

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

double __thiscall
NEST::NESTcalc::FanoER
          (NESTcalc *this,double density,double Nq_mean,double efield,
          vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar1) {
    dVar2 = 0.1115;
  }
  else {
    dVar2 = pow(density,3.0);
    dVar3 = dVar2 * 0.0015957 + density * density * -0.0057042 + density * -0.029623 + 0.12707;
    dVar2 = dVar3;
    if ((this->fdetector->inGas == false) &&
       (dVar2 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[6], dVar2 < 0.0)) {
      if (Nq_mean < 0.0) {
        dVar4 = sqrt(Nq_mean);
      }
      else {
        dVar4 = SQRT(Nq_mean);
      }
      dVar5 = pow(efield,0.5);
      dVar2 = dVar5 * ABS(dVar2) * dVar4 + dVar3;
    }
  }
  return dVar2;
}

Assistant:

double NESTcalc::FanoER(double density, double Nq_mean, double efield,
                        const std::vector<double> &NRERWidthsParam) {
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))  // liquid argon
    return 0.1115;  // T&I. conflicting reports of .107 (Doke) & ~0.1 elsewhere
  double Fano =
      0.12707 - 0.029623 * density -  // Fano factor is  << 1
      0.0057042 *
          pow(density,
              2.) +  //~0.1 for GXe w/ formula from Bolotnikov et al. 1995
      0.0015957 *
          pow(density,
              3.);  // to get it to be ~0.03 for LXe (E Dahl Ph.D. thesis)
  if (!fdetector->get_inGas()) {
    if (NRERWidthsParam[6] < 0.)
      Fano += fabs(NRERWidthsParam[6]) * sqrt(Nq_mean) * pow(efield, 0.5);
    else
      Fano = NRERWidthsParam[6];
  }
  return Fano;
}